

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O3

void __thiscall wabt::AST::~AST(AST *this)

{
  pointer puVar1;
  
  if (this->f != (Func *)0x0) {
    ModuleContext::EndFunc(this->mc);
  }
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->blocks_closed).super__Bvector_base<std::allocator<bool>_>);
  puVar1 = (this->block_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
  ::_M_erase(&(this->vars_defined)._M_t,
             (_Link_type)(this->vars_defined)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
            );
  std::vector<wabt::Node,_std::allocator<wabt::Node>_>::~vector(&this->predecls);
  std::vector<wabt::Node,_std::allocator<wabt::Node>_>::~vector(&this->exp_stack);
  return;
}

Assistant:

~AST() {
    if (f) mc.EndFunc();
  }